

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfread.c
# Opt level: O0

FT_Error pcf_load_font(FT_Stream stream,PCF_Face face,FT_Long face_index)

{
  FT_Memory memory_00;
  FT_Bool FVar1;
  PCF_Property pPVar2;
  FT_String *pFVar3;
  FT_Bitmap_Size *pFVar4;
  FT_Long FVar5;
  PCF_Property pPVar6;
  FT_Pointer pvVar7;
  short local_cc;
  long local_c8;
  short local_bc;
  long local_b8;
  int local_ac;
  long local_a8;
  FT_Long local_a0;
  long local_98;
  short local_8c;
  long local_88;
  short local_7c;
  long local_78;
  PCF_Property charset_encoding;
  PCF_Property charset_registry;
  FT_Short resolution_y;
  FT_Short resolution_x;
  FT_Bitmap_Size *bsize;
  PCF_Property prop;
  FT_Bool hasBDFAccelerators;
  FT_Memory memory;
  PCF_Face pPStack_30;
  FT_Error error;
  FT_Face root;
  FT_Long face_index_local;
  PCF_Face face_local;
  FT_Stream stream_local;
  
  memory_00 = (face->root).memory;
  pPStack_30 = face;
  root = (FT_Face)face_index;
  face_index_local = (FT_Long)face;
  face_local = (PCF_Face)stream;
  memory._4_4_ = pcf_read_TOC(stream,face);
  if (memory._4_4_ == 0) {
    (pPStack_30->root).num_faces = 1;
    (pPStack_30->root).face_index = 0;
    if ((long)root < 0) {
      return 0;
    }
    memory._4_4_ = pcf_get_properties((FT_Stream)face_local,(PCF_Face)face_index_local);
    if (memory._4_4_ == 0) {
      FVar1 = pcf_has_table_type(*(PCF_Table *)(face_index_local + 0x170),
                                 *(FT_ULong *)(face_index_local + 0x168),0x100);
      if (FVar1 == '\0') {
        memory._4_4_ = pcf_get_accel((FT_Stream)face_local,(PCF_Face)face_index_local,2);
        if (memory._4_4_ != 0) goto LAB_002fc967;
        memory._4_4_ = 0;
      }
      memory._4_4_ = pcf_get_metrics((FT_Stream)face_local,(PCF_Face)face_index_local);
      if ((((memory._4_4_ == 0) &&
           (memory._4_4_ = pcf_get_bitmaps((FT_Stream)face_local,(PCF_Face)face_index_local),
           memory._4_4_ == 0)) &&
          (memory._4_4_ = pcf_get_encodings((FT_Stream)face_local,(PCF_Face)face_index_local),
          memory._4_4_ == 0)) &&
         ((FVar1 == '\0' ||
          (memory._4_4_ = pcf_get_accel((FT_Stream)face_local,(PCF_Face)face_index_local,0x100),
          memory._4_4_ == 0)))) {
        memory._4_4_ = 0;
        (pPStack_30->root).face_flags = (pPStack_30->root).face_flags | 0x12;
        if (*(char *)(face_index_local + 0x17b) != '\0') {
          (pPStack_30->root).face_flags = (pPStack_30->root).face_flags | 4;
        }
        memory._4_4_ = pcf_interpret_style((PCF_Face)face_index_local);
        if (memory._4_4_ == 0) {
          pPVar2 = pcf_find_property((PCF_Face)face_index_local,"FAMILY_NAME");
          if ((pPVar2 == (PCF_Property)0x0) || (pPVar2->isString == '\0')) {
            (pPStack_30->root).family_name = (FT_String *)0x0;
          }
          else {
            pFVar3 = (FT_String *)
                     ft_mem_strdup(memory_00,(pPVar2->value).atom,(FT_Error *)((long)&memory + 4));
            (pPStack_30->root).family_name = pFVar3;
            if (memory._4_4_ != 0) goto LAB_002fc967;
          }
          (pPStack_30->root).num_glyphs = *(FT_Long *)(face_index_local + 0x208);
          (pPStack_30->root).num_fixed_sizes = 1;
          pFVar4 = (FT_Bitmap_Size *)ft_mem_alloc(memory_00,0x20,(FT_Error *)((long)&memory + 4));
          (pPStack_30->root).available_sizes = pFVar4;
          if (memory._4_4_ == 0) {
            pFVar4 = (pPStack_30->root).available_sizes;
            charset_registry._6_2_ = 0;
            charset_registry._4_2_ = 0;
            if (*(long *)(face_index_local + 0x180) + *(long *)(face_index_local + 0x188) < 0) {
              local_78 = -(*(long *)(face_index_local + 0x180) + *(long *)(face_index_local + 0x188)
                          );
            }
            else {
              local_78 = *(long *)(face_index_local + 0x180) + *(long *)(face_index_local + 0x188);
            }
            if (local_78 < 0x8000) {
              if ((short)((short)*(undefined8 *)(face_index_local + 0x180) +
                         (short)*(undefined8 *)(face_index_local + 0x188)) < 0) {
                local_7c = -((short)*(undefined8 *)(face_index_local + 0x180) +
                            (short)*(undefined8 *)(face_index_local + 0x188));
              }
              else {
                local_7c = (short)*(undefined8 *)(face_index_local + 0x180) +
                           (short)*(undefined8 *)(face_index_local + 0x188);
              }
              pFVar4->height = local_7c;
            }
            else {
              pFVar4->height = 0x7fff;
            }
            pPVar2 = pcf_find_property((PCF_Face)face_index_local,"AVERAGE_WIDTH");
            if (pPVar2 == (PCF_Property)0x0) {
              pFVar4->width = (FT_Short)((long)(pFVar4->height * 2 + 1) / 3);
            }
            else {
              if ((pPVar2->value).l < 0) {
                local_88 = -(pPVar2->value).l;
              }
              else {
                local_88 = (pPVar2->value).l;
              }
              if (local_88 < 0x4fff2) {
                if ((short)(((pPVar2->value).l + 5) / 10) < 0) {
                  local_8c = -(short)(((pPVar2->value).l + 5) / 10);
                }
                else {
                  local_8c = (short)(((pPVar2->value).l + 5) / 10);
                }
                pFVar4->width = local_8c;
              }
              else {
                pFVar4->width = 0x7fff;
              }
            }
            pPVar2 = pcf_find_property((PCF_Face)face_index_local,"POINT_SIZE");
            if (pPVar2 != (PCF_Property)0x0) {
              if ((pPVar2->value).l < 0) {
                local_98 = -(pPVar2->value).l;
              }
              else {
                local_98 = (pPVar2->value).l;
              }
              if (local_98 < 0x504c3) {
                if ((pPVar2->value).l < 0) {
                  local_a0 = -(pPVar2->value).l;
                }
                else {
                  local_a0 = (pPVar2->value).l;
                }
                FVar5 = FT_MulDiv(local_a0,0x70800,0x11a4e);
                pFVar4->size = FVar5;
              }
              else {
                pFVar4->size = 0x7fff;
              }
            }
            pPVar2 = pcf_find_property((PCF_Face)face_index_local,"PIXEL_SIZE");
            if (pPVar2 != (PCF_Property)0x0) {
              if ((pPVar2->value).l < 0) {
                local_a8 = -(pPVar2->value).l;
              }
              else {
                local_a8 = (pPVar2->value).l;
              }
              if (local_a8 < 0x8000) {
                if ((short)(pPVar2->value).l < 0) {
                  local_ac = -(int)(short)(pPVar2->value).l;
                }
                else {
                  local_ac = (int)(short)(pPVar2->value).l;
                }
                pFVar4->y_ppem = (long)(local_ac << 6);
              }
              else {
                pFVar4->y_ppem = 0x1fffc0;
              }
            }
            pPVar2 = pcf_find_property((PCF_Face)face_index_local,"RESOLUTION_X");
            if (pPVar2 != (PCF_Property)0x0) {
              if ((pPVar2->value).l < 0) {
                local_b8 = -(pPVar2->value).l;
              }
              else {
                local_b8 = (pPVar2->value).l;
              }
              if (local_b8 < 0x8000) {
                if ((short)(pPVar2->value).l < 0) {
                  local_bc = -(short)(pPVar2->value).l;
                }
                else {
                  local_bc = (short)(pPVar2->value).l;
                }
                charset_registry._6_2_ = local_bc;
              }
              else {
                charset_registry._6_2_ = 0x7fff;
              }
            }
            pPVar2 = pcf_find_property((PCF_Face)face_index_local,"RESOLUTION_Y");
            if (pPVar2 != (PCF_Property)0x0) {
              if ((pPVar2->value).l < 0) {
                local_c8 = -(pPVar2->value).l;
              }
              else {
                local_c8 = (pPVar2->value).l;
              }
              if (local_c8 < 0x8000) {
                if ((short)(pPVar2->value).l < 0) {
                  local_cc = -(short)(pPVar2->value).l;
                }
                else {
                  local_cc = (short)(pPVar2->value).l;
                }
                charset_registry._4_2_ = local_cc;
              }
              else {
                charset_registry._4_2_ = 0x7fff;
              }
            }
            if ((pFVar4->y_ppem == 0) &&
               (pFVar4->y_ppem = pFVar4->size, charset_registry._4_2_ != 0)) {
              FVar5 = FT_MulDiv(pFVar4->y_ppem,(long)charset_registry._4_2_,0x48);
              pFVar4->y_ppem = FVar5;
            }
            if ((charset_registry._6_2_ == 0) || (charset_registry._4_2_ == 0)) {
              pFVar4->x_ppem = pFVar4->y_ppem;
            }
            else {
              FVar5 = FT_MulDiv(pFVar4->y_ppem,(long)charset_registry._6_2_,
                                (long)charset_registry._4_2_);
              pFVar4->x_ppem = FVar5;
            }
            pPVar2 = pcf_find_property((PCF_Face)face_index_local,"CHARSET_REGISTRY");
            pPVar6 = pcf_find_property((PCF_Face)face_index_local,"CHARSET_ENCODING");
            if ((((pPVar2 != (PCF_Property)0x0) && (pPVar2->isString != '\0')) &&
                (pPVar6 != (PCF_Property)0x0)) && (pPVar6->isString != '\0')) {
              pvVar7 = ft_mem_strdup(memory_00,(pPVar6->value).atom,(FT_Error *)((long)&memory + 4))
              ;
              *(FT_Pointer *)(face_index_local + 0x150) = pvVar7;
              if (memory._4_4_ == 0) {
                pvVar7 = ft_mem_strdup(memory_00,(pPVar2->value).atom,
                                       (FT_Error *)((long)&memory + 4));
                *(FT_Pointer *)(face_index_local + 0x158) = pvVar7;
              }
            }
          }
        }
      }
    }
  }
LAB_002fc967:
  if (memory._4_4_ != 0) {
    memory._4_4_ = 3;
  }
  return memory._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pcf_load_font( FT_Stream  stream,
                 PCF_Face   face,
                 FT_Long    face_index )
  {
    FT_Face    root   = FT_FACE( face );
    FT_Error   error;
    FT_Memory  memory = FT_FACE( face )->memory;
    FT_Bool    hasBDFAccelerators;


    error = pcf_read_TOC( stream, face );
    if ( error )
      goto Exit;

    root->num_faces  = 1;
    root->face_index = 0;

    /* If we are performing a simple font format check, exit immediately. */
    if ( face_index < 0 )
      return FT_Err_Ok;

    error = pcf_get_properties( stream, face );
    if ( error )
      goto Exit;

    /* Use the old accelerators if no BDF accelerators are in the file. */
    hasBDFAccelerators = pcf_has_table_type( face->toc.tables,
                                             face->toc.count,
                                             PCF_BDF_ACCELERATORS );
    if ( !hasBDFAccelerators )
    {
      error = pcf_get_accel( stream, face, PCF_ACCELERATORS );
      if ( error )
        goto Exit;
    }

    /* metrics */
    error = pcf_get_metrics( stream, face );
    if ( error )
      goto Exit;

    /* bitmaps */
    error = pcf_get_bitmaps( stream, face );
    if ( error )
      goto Exit;

    /* encodings */
    error = pcf_get_encodings( stream, face );
    if ( error )
      goto Exit;

    /* BDF style accelerators (i.e. bounds based on encoded glyphs) */
    if ( hasBDFAccelerators )
    {
      error = pcf_get_accel( stream, face, PCF_BDF_ACCELERATORS );
      if ( error )
        goto Exit;
    }

    /* XXX: TO DO: inkmetrics and glyph_names are missing */

    /* now construct the face object */
    {
      PCF_Property  prop;


      root->face_flags |= FT_FACE_FLAG_FIXED_SIZES |
                          FT_FACE_FLAG_HORIZONTAL;

      if ( face->accel.constantWidth )
        root->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      if ( FT_SET_ERROR( pcf_interpret_style( face ) ) )
        goto Exit;

      prop = pcf_find_property( face, "FAMILY_NAME" );
      if ( prop && prop->isString )
      {

#ifdef PCF_CONFIG_OPTION_LONG_FAMILY_NAMES

        PCF_Driver  driver = (PCF_Driver)FT_FACE_DRIVER( face );


        if ( !driver->no_long_family_names )
        {
          /* Prepend the foundry name plus a space to the family name.     */
          /* There are many fonts just called `Fixed' which look           */
          /* completely different, and which have nothing to do with each  */
          /* other.  When selecting `Fixed' in KDE or Gnome one gets       */
          /* results that appear rather random, the style changes often if */
          /* one changes the size and one cannot select some fonts at all. */
          /*                                                               */
          /* We also check whether we have `wide' characters; all put      */
          /* together, we get family names like `Sony Fixed' or `Misc      */
          /* Fixed Wide'.                                                  */

          PCF_Property  foundry_prop, point_size_prop, average_width_prop;

          int  l    = ft_strlen( prop->value.atom ) + 1;
          int  wide = 0;


          foundry_prop       = pcf_find_property( face, "FOUNDRY" );
          point_size_prop    = pcf_find_property( face, "POINT_SIZE" );
          average_width_prop = pcf_find_property( face, "AVERAGE_WIDTH" );

          if ( point_size_prop && average_width_prop )
          {
            if ( average_width_prop->value.l >= point_size_prop->value.l )
            {
              /* This font is at least square shaped or even wider */
              wide = 1;
              l   += ft_strlen( " Wide" );
            }
          }

          if ( foundry_prop && foundry_prop->isString )
          {
            l += ft_strlen( foundry_prop->value.atom ) + 1;

            if ( FT_QALLOC( root->family_name, l ) )
              goto Exit;

            ft_strcpy( root->family_name, foundry_prop->value.atom );
            ft_strcat( root->family_name, " " );
            ft_strcat( root->family_name, prop->value.atom );
          }
          else
          {
            if ( FT_QALLOC( root->family_name, l ) )
              goto Exit;

            ft_strcpy( root->family_name, prop->value.atom );
          }

          if ( wide )
            ft_strcat( root->family_name, " Wide" );
        }
        else

#endif /* PCF_CONFIG_OPTION_LONG_FAMILY_NAMES */

        {
          if ( FT_STRDUP( root->family_name, prop->value.atom ) )
            goto Exit;
        }
      }
      else
        root->family_name = NULL;

      root->num_glyphs = (FT_Long)face->nmetrics;

      root->num_fixed_sizes = 1;
      if ( FT_NEW( root->available_sizes ) )
        goto Exit;

      {
        FT_Bitmap_Size*  bsize = root->available_sizes;
        FT_Short         resolution_x = 0, resolution_y = 0;


        /* for simplicity, we take absolute values of integer properties */

#if 0
        bsize->height = face->accel.maxbounds.ascent << 6;
#endif

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( face->accel.fontAscent + face->accel.fontDescent < 0 )
          FT_TRACE0(( "pcf_load_font: negative height\n" ));
#endif
        if ( FT_ABS( face->accel.fontAscent +
                     face->accel.fontDescent ) > 0x7FFF )
        {
          bsize->height = 0x7FFF;
          FT_TRACE0(( "pcf_load_font: clamping height to value %d\n",
                      bsize->height ));
        }
        else
          bsize->height = FT_ABS( (FT_Short)( face->accel.fontAscent +
                                              face->accel.fontDescent ) );

        prop = pcf_find_property( face, "AVERAGE_WIDTH" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative average width\n" ));
#endif
          if ( ( FT_ABS( prop->value.l ) > 0x7FFFL * 10 - 5 ) )
          {
            bsize->width = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping average width to value %d\n",
                        bsize->width ));
          }
          else
            bsize->width = FT_ABS( (FT_Short)( ( prop->value.l + 5 ) / 10 ) );
        }
        else
        {
          /* this is a heuristical value */
          bsize->width = ( bsize->height * 2 + 1 ) / 3;
        }

        prop = pcf_find_property( face, "POINT_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative point size\n" ));
#endif
          /* convert from 722.7 decipoints to 72 points per inch */
          if ( FT_ABS( prop->value.l ) > 0x504C2L ) /* 0x7FFF * 72270/7200 */
          {
            bsize->size = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping point size to value %ld\n",
                        bsize->size ));
          }
          else
            bsize->size = FT_MulDiv( FT_ABS( prop->value.l ),
                                     64 * 7200,
                                     72270L );
        }

        prop = pcf_find_property( face, "PIXEL_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative pixel size\n" ));
#endif
          if ( FT_ABS( prop->value.l ) > 0x7FFF )
          {
            bsize->y_ppem = 0x7FFF << 6;
            FT_TRACE0(( "pcf_load_font: clamping pixel size to value %ld\n",
                        bsize->y_ppem ));
          }
          else
            bsize->y_ppem = FT_ABS( (FT_Short)prop->value.l ) << 6;
        }

        prop = pcf_find_property( face, "RESOLUTION_X" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative X resolution\n" ));
#endif
          if ( FT_ABS( prop->value.l ) > 0x7FFF )
          {
            resolution_x = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping X resolution to value %d\n",
                        resolution_x ));
          }
          else
            resolution_x = FT_ABS( (FT_Short)prop->value.l );
        }

        prop = pcf_find_property( face, "RESOLUTION_Y" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "pcf_load_font: negative Y resolution\n" ));
#endif
          if ( FT_ABS( prop->value.l ) > 0x7FFF )
          {
            resolution_y = 0x7FFF;
            FT_TRACE0(( "pcf_load_font: clamping Y resolution to value %d\n",
                        resolution_y ));
          }
          else
            resolution_y = FT_ABS( (FT_Short)prop->value.l );
        }

        if ( bsize->y_ppem == 0 )
        {
          bsize->y_ppem = bsize->size;
          if ( resolution_y )
            bsize->y_ppem = FT_MulDiv( bsize->y_ppem, resolution_y, 72 );
        }
        if ( resolution_x && resolution_y )
          bsize->x_ppem = FT_MulDiv( bsize->y_ppem,
                                     resolution_x,
                                     resolution_y );
        else
          bsize->x_ppem = bsize->y_ppem;
      }

      /* set up charset */
      {
        PCF_Property  charset_registry, charset_encoding;


        charset_registry = pcf_find_property( face, "CHARSET_REGISTRY" );
        charset_encoding = pcf_find_property( face, "CHARSET_ENCODING" );

        if ( charset_registry && charset_registry->isString &&
             charset_encoding && charset_encoding->isString )
        {
          if ( FT_STRDUP( face->charset_encoding,
                          charset_encoding->value.atom ) ||
               FT_STRDUP( face->charset_registry,
                          charset_registry->value.atom ) )
            goto Exit;
        }
      }
    }

  Exit:
    if ( error )
    {
      /* This is done to respect the behaviour of the original */
      /* PCF font driver.                                      */
      error = FT_THROW( Invalid_File_Format );
    }

    return error;
  }